

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O1

void dequantize_row_iq4_nl(block_iq4_nl *x,float *y,int64_t k)

{
  float fVar1;
  byte bVar2;
  long lVar3;
  uint8_t *puVar4;
  long lVar5;
  int j;
  long lVar6;
  
  lVar3 = k + 0x1f;
  if (-1 < k) {
    lVar3 = k;
  }
  if (0x1f < k) {
    puVar4 = x->qs;
    lVar5 = 0;
    do {
      fVar1 = ggml_table_f32_f16[x[lVar5].d];
      lVar6 = 0;
      do {
        bVar2 = puVar4[lVar6];
        y[lVar6] = (float)(int)kvalues_iq4nl[bVar2 & 0xf] * fVar1;
        y[lVar6 + 0x10] = (float)(int)kvalues_iq4nl[bVar2 >> 4] * fVar1;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 0x10);
      y = y + 0x20;
      lVar5 = lVar5 + 1;
      puVar4 = puVar4 + 0x12;
    } while (lVar5 != lVar3 >> 5);
  }
  return;
}

Assistant:

void dequantize_row_iq4_nl(const block_iq4_nl * GGML_RESTRICT x, float * GGML_RESTRICT y, int64_t k) {
    assert(k % QK4_NL == 0);
    const int64_t nb = k / QK4_NL;

    for (int i = 0; i < nb; i++) {

        const uint8_t * qs = x[i].qs;

        const float d = GGML_FP16_TO_FP32(x[i].d);
        for (int j = 0; j < QK4_NL/2; ++j) {
            y[j+       0] = d * kvalues_iq4nl[qs[j] & 0xf];
            y[j+QK4_NL/2] = d * kvalues_iq4nl[qs[j] >>  4];
        }
        y  += QK4_NL;
        qs += QK4_NL/2;
    }
}